

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall
Lodtalk::StackInterpreter::activateBlockClosure(StackInterpreter *this,BlockClosure *closure)

{
  uintptr_t uVar1;
  CompiledMethod *pCVar2;
  undefined8 uVar3;
  StackMemory *pSVar4;
  uint8_t *puVar5;
  ObjectHeader OVar6;
  ulong uVar7;
  size_t sVar8;
  size_t i;
  long lVar9;
  
  uVar7 = Oop::decodeSmallInteger(&closure->numArgs);
  uVar1 = (closure->outerContext).field_0.uintValue;
  pCVar2 = *(CompiledMethod **)(uVar1 + 0x20);
  uVar3 = *(undefined8 *)(uVar1 + 0x30);
  pSVar4 = this->stack;
  puVar5 = (pSVar4->stackFrame).stackPointer;
  (pSVar4->stackFrame).stackPointer = puVar5 + -8;
  *(uint8_t **)(puVar5 + -8) = (pSVar4->stackFrame).framePointer;
  pSVar4 = this->stack;
  puVar5 = (pSVar4->stackFrame).stackPointer;
  (pSVar4->stackFrame).framePointer = puVar5;
  (pSVar4->stackFrame).stackPointer = puVar5 + -8;
  *(CompiledMethod **)(puVar5 + -8) = pCVar2;
  this->method = pCVar2;
  pSVar4 = this->stack;
  puVar5 = (pSVar4->stackFrame).stackPointer;
  *(ulong *)(puVar5 + -8) = uVar7 & 0xff | 0x100;
  (pSVar4->stackFrame).stackPointer = puVar5 + -0x10;
  *(undefined8 **)(puVar5 + -0x10) = &NilObject;
  puVar5 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar5 + -8;
  *(undefined8 *)(puVar5 + -8) = uVar3;
  sVar8 = ProtoObject::getNumberOfElements((ProtoObject *)closure);
  for (lVar9 = 0; sVar8 - 3 != lVar9; lVar9 = lVar9 + 1) {
    OVar6 = (&closure[1].super_Object)[lVar9].super_ProtoObject.object_header_;
    puVar5 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar5 + -8;
    *(ObjectHeader *)(puVar5 + -8) = OVar6;
  }
  garbageCollectionSafePoint(this);
  fetchFrameData(this);
  sVar8 = Oop::decodeSmallInteger(&closure->startpc);
  this->pc = sVar8;
  checkStackOverflow(this);
  sVar8 = this->pc;
  this->pc = sVar8 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar8);
  return;
}

Assistant:

void StackInterpreter::activateBlockClosure(BlockClosure *closure)
{
    int numArguments = (int)closure->numArgs.decodeSmallInteger();

    // Get the receiver and the method.
    auto outerContext = closure->getOuterContext();
    auto newMethod = outerContext->method;
    auto receiver = outerContext->receiver;

    // Push the frame pointer.
	pushPointer(stack->getFramePointer()); // Return frame pointer.

	// Set the new frame pointer.
	stack->setFramePointer(stack->getStackPointer());

	// Push the method object.
	pushOop(Oop::fromPointer(newMethod));
	this->method = newMethod;

    // Encode frame metadata
	pushUInt(encodeFrameMetaData(false, true, numArguments));

	// Push the nil this context.
	pushOop(Oop());

	// Push the receiver oop.
	pushOop(receiver);

    // Copy the elements
    auto copiedElements = closure->getNumberOfElements() - 3;
    for(size_t i = 0; i < copiedElements; ++i)
        pushOop(closure->copiedData[i]);

    // Safe point for GC.
    garbageCollectionSafePoint();

    // Fetch the frame data.
	fetchFrameData();

    // Set the initial pc
    pc = closure->startpc.decodeSmallInteger();

    // Check for stack overflow.
    checkStackOverflow();

    // Fetch the first instruction opcode
	fetchNextInstructionOpcode();
}